

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O1

void __thiscall
Potassco::ProgramOptions::OptionContext::insertOption
          (OptionContext *this,size_t groupId,SharedOptPtr *opt)

{
  byte bVar1;
  Option *pOVar2;
  pointer pcVar3;
  DuplicateOption *pDVar4;
  unsigned_long uVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_bool>
  pVar6;
  string shortName;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_78;
  ushort *local_50;
  undefined8 local_48;
  ushort local_40;
  undefined1 local_3e;
  
  pOVar2 = opt->ptr_;
  uVar5 = (long)(this->options_).
                super__Vector_base<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->options_).
                super__Vector_base<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  bVar1 = pOVar2->value_->optAlias_;
  if (bVar1 != 0) {
    local_50 = &local_40;
    local_40 = (ushort)bVar1 << 8 | 0x2d;
    local_48 = 2;
    local_3e = 0;
    local_78.first._M_dataplus._M_p = (pointer)&local_78.first.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_78);
    local_78.second = uVar5;
    pVar6 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
            ::_M_insert_unique<std::pair<std::__cxx11::string_const,unsigned_long>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                        *)this,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.first._M_dataplus._M_p != &local_78.first.field_2) {
      operator_delete(local_78.first._M_dataplus._M_p);
    }
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pDVar4 = (DuplicateOption *)__cxa_allocate_exception(0x58);
      DuplicateOption::DuplicateOption(pDVar4,&this->caption_,&pOVar2->name_);
      __cxa_throw(pDVar4,&DuplicateOption::typeinfo,ContextError::~ContextError);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
  }
  if ((pOVar2->name_)._M_string_length != 0) {
    local_78.first._M_dataplus._M_p = (pointer)&local_78.first.field_2;
    pcVar3 = (pOVar2->name_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar3,pcVar3 + (pOVar2->name_)._M_string_length);
    local_78.second = uVar5;
    pVar6 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
            ::_M_insert_unique<std::pair<std::__cxx11::string_const,unsigned_long>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                        *)this,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.first._M_dataplus._M_p != &local_78.first.field_2) {
      operator_delete(local_78.first._M_dataplus._M_p);
    }
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pDVar4 = (DuplicateOption *)__cxa_allocate_exception(0x58);
      DuplicateOption::DuplicateOption(pDVar4,&this->caption_,&pOVar2->name_);
      __cxa_throw(pDVar4,&DuplicateOption::typeinfo,ContextError::~ContextError);
    }
  }
  std::
  vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
  ::push_back(&this->options_,opt);
  std::
  vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
  ::push_back(&(this->groups_).
               super__Vector_base<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
               ._M_impl.super__Vector_impl_data._M_start[groupId].options_,opt);
  return;
}

Assistant:

void OptionContext::insertOption(size_t groupId, const SharedOptPtr& opt) {
	const string& l = opt->name();
	key_type k(options_.size());
	if (opt->alias()) {
		char sName[2] = {'-', opt->alias()};
		std::string shortName(sName, 2);
		if (!index_.insert(Name2Key::value_type(shortName, k)).second) {
			throw DuplicateOption(caption(), l);
		}
	}
	if (!l.empty()) {
		if (!index_.insert(Name2Key::value_type(l, k)).second) {
			throw DuplicateOption(caption(), l);
		}
	}
	options_.push_back(opt);
	groups_[groupId].options_.push_back(opt);
}